

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O2

void __thiscall
duckdb::MultiFileReader::FinalizeChunk
          (MultiFileReader *this,ClientContext *context,MultiFileBindData *bind_data,
          BaseFileReader *reader,MultiFileReaderData *reader_data,DataChunk *input_chunk,
          DataChunk *output_chunk,ExpressionExecutor *executor,
          optional_ptr<duckdb::MultiFileReaderGlobalState,_true> global_state)

{
  reference result;
  ulong __n;
  string first_message;
  string extended_error;
  ErrorData error;
  
  executor->chunk = input_chunk;
  for (__n = 0; __n < (ulong)((long)(executor->expressions).
                                    super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                                    .
                                    super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(executor->expressions).
                                    super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                                    .
                                    super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    result = vector<duckdb::Vector,_true>::get<true>(&output_chunk->data,__n);
    ExpressionExecutor::ExecuteExpression(executor,__n,result);
  }
  output_chunk->count = input_chunk->count;
  return;
}

Assistant:

void MultiFileReader::FinalizeChunk(ClientContext &context, const MultiFileBindData &bind_data, BaseFileReader &reader,
                                    const MultiFileReaderData &reader_data, DataChunk &input_chunk,
                                    DataChunk &output_chunk, ExpressionExecutor &executor,
                                    optional_ptr<MultiFileReaderGlobalState> global_state) {
	executor.SetChunk(input_chunk);
	for (idx_t i = 0; i < executor.expressions.size(); i++) {
		try {
			executor.ExecuteExpression(i, output_chunk.data[i]);
		} catch (std::exception &ex) {
			// error while converting - try to create a nice error message
			ErrorData error(ex);
			if (error.Type() == ExceptionType::INTERNAL) {
				throw;
			}
			auto &original_error = error.RawMessage();
			string first_message;
			string extended_error =
			    GetExtendedMultiFileError(bind_data, *executor.expressions[i], reader, i, first_message);
			throw ConversionException("Error while reading file \"%s\": %s: %s\n\n%s", reader.GetFileName(),
			                          first_message, original_error, extended_error);
		}
	}
	output_chunk.SetCardinality(input_chunk.size());
}